

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Font.cpp
# Opt level: O0

void __thiscall sf::Font::Page::Page(Page *this)

{
  Texture *in_RDI;
  Image *unaff_retaddr;
  IntRect *in_stack_00000008;
  Image *in_stack_00000010;
  Texture *in_stack_00000018;
  int y;
  int x;
  Image image;
  undefined4 in_stack_ffffffffffffff80;
  int iVar1;
  undefined4 in_stack_ffffffffffffff84;
  int iVar2;
  uint *puVar3;
  undefined1 smooth;
  Texture *this_00;
  Rect<int> local_58;
  Color local_48;
  int local_44;
  int local_40;
  Color local_3c [11];
  Color *in_stack_fffffffffffffff0;
  Texture *pTVar4;
  
  this_00 = in_RDI;
  pTVar4 = in_RDI;
  std::
  map<unsigned_long_long,_sf::Glyph,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_sf::Glyph>_>_>
  ::map((map<unsigned_long_long,_sf::Glyph,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_sf::Glyph>_>_>
         *)0x12e499);
  Texture::Texture((Texture *)&in_RDI[1].m_actualSize);
  this_00[2].m_actualSize.x = 3;
  puVar3 = &this_00[2].m_texture;
  std::vector<sf::Font::Row,_std::allocator<sf::Font::Row>_>::vector
            ((vector<sf::Font::Row,_std::allocator<sf::Font::Row>_> *)0x12e4c8);
  Image::Image((Image *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  Color::Color(local_3c,0xff,0xff,0xff,'\0');
  Image::create(unaff_retaddr,(uint)((ulong)pTVar4 >> 0x20),(uint)pTVar4,in_stack_fffffffffffffff0);
  for (local_40 = 0; local_40 < 2; local_40 = local_40 + 1) {
    for (local_44 = 0; local_44 < 2; local_44 = local_44 + 1) {
      iVar1 = local_40;
      iVar2 = local_44;
      Color::Color(&local_48,0xff,0xff,0xff,0xff);
      Image::setPixel((Image *)this_00,(uint)((ulong)puVar3 >> 0x20),(uint)puVar3,
                      (Color *)CONCAT44(iVar2,iVar1));
    }
  }
  Rect<int>::Rect(&local_58);
  smooth = (undefined1)((ulong)puVar3 >> 0x38);
  Texture::loadFromImage(in_stack_00000018,in_stack_00000010,in_stack_00000008);
  Texture::setSmooth(this_00,(bool)smooth);
  Image::~Image((Image *)0x12e61c);
  return;
}

Assistant:

Font::Page::Page() :
nextRow(3)
{
    // Make sure that the texture is initialized by default
    sf::Image image;
    image.create(128, 128, Color(255, 255, 255, 0));

    // Reserve a 2x2 white square for texturing underlines
    for (int x = 0; x < 2; ++x)
        for (int y = 0; y < 2; ++y)
            image.setPixel(x, y, Color(255, 255, 255, 255));

    // Create the texture
    texture.loadFromImage(image);
    texture.setSmooth(true);
}